

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

FrameBuffer * __thiscall Imf_2_5::TiledInputFile::frameBuffer(TiledInputFile *this)

{
  Lock *this_00;
  long in_RDI;
  Lock lock;
  undefined8 in_stack_ffffffffffffffe0;
  Mutex *in_stack_ffffffffffffffe8;
  Lock *in_stack_fffffffffffffff0;
  
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
             SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x38,0));
  this_00 = (Lock *)(*(long *)(in_RDI + 8) + 0x78);
  IlmThread_2_5::Lock::~Lock(this_00);
  return (FrameBuffer *)this_00;
}

Assistant:

const FrameBuffer &
TiledInputFile::frameBuffer () const
{
    Lock lock (*_data->_streamData);
    return _data->frameBuffer;
}